

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::a64::EmitHelper::emitArgMove
          (EmitHelper *this,BaseReg *dst_,TypeId dstTypeId,Operand_ *src_,TypeId srcTypeId,
          char *comment)

{
  byte bVar1;
  byte bVar2;
  Error EVar3;
  TypeId *pTVar4;
  uint uVar5;
  uint32_t uVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  InstId instId;
  BaseEmitter *this_00;
  Reg dst;
  Operand src;
  
  uVar7 = CONCAT71(in_register_00000011,dstTypeId);
  if ((int)uVar7 == 0) {
    dst.super_BaseReg.super_Operand.super_Operand_._signature._bits._0_1_ =
         (byte)(dst_->super_Operand).super_Operand_._signature._bits >> 3;
    pTVar4 = Support::Array<asmjit::v1_14::TypeId,_32UL>::operator[]<asmjit::v1_14::RegType>
                       ((Array<asmjit::v1_14::TypeId,_32UL> *)
                        (_archTraits +
                        (ulong)(((this->super_BaseEmitHelper)._emitter)->_environment)._arch * 0xd8
                        + 0x94),(RegType *)&dst);
    uVar7 = (ulong)*pTVar4;
  }
  bVar2 = (byte)uVar7;
  if (((byte)(bVar2 + 0x9b) < 0xbb) || ((bVar2 & 0x7e) == 0x20)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/a64emithelper.cpp"
               ,0xa1,"TypeUtils::isValid(dstTypeId) && !TypeUtils::isAbstract(dstTypeId)");
  }
  if (((byte)(srcTypeId + ~_kVec512End) < 0xbb) || ((srcTypeId & 0x7e) == _kBaseStart)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/a64emithelper.cpp"
               ,0xa2,"TypeUtils::isValid(srcTypeId) && !TypeUtils::isAbstract(srcTypeId)");
  }
  dst.super_BaseReg.super_Operand.super_Operand_._signature._bits =
       (dst_->super_Operand).super_Operand_._signature._bits;
  dst.super_BaseReg.super_Operand.super_Operand_._baseId =
       (dst_->super_Operand).super_Operand_._baseId;
  dst.super_BaseReg.super_Operand.super_Operand_._data =
       *&(dst_->super_Operand).super_Operand_._data;
  src.super_Operand_._signature._bits = (src_->_signature)._bits;
  src.super_Operand_._baseId = src_->_baseId;
  src.super_Operand_._data[0] = src_->_data[0];
  src.super_Operand_._data[1] = src_->_data[1];
  bVar1 = TypeUtils::_typeData[(ulong)srcTypeId + 0x100];
  if (((byte)(srcTypeId - _kBaseStart) < 10) && ((byte)(bVar2 - 0x20) < 10)) {
    dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 0x4000031;
    if (TypeUtils::_typeData[(uVar7 & 0xff) + 0x100] == '\b') {
      dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 0x8000039;
    }
    this_00 = (this->super_BaseEmitHelper)._emitter;
    this_00->_inlineComment = comment;
    if ((src.super_Operand_._signature._bits & 7) == 2) {
      EVar3 = (*(code *)(&DAT_0014cde4 + *(int *)(&DAT_0014cde4 + (ulong)(srcTypeId - 0x22) * 4)))()
      ;
      return EVar3;
    }
    if ((src.super_Operand_._signature._bits & 7) != 1) goto LAB_00130d57;
    instId = 0xf4;
    src.super_Operand_._signature._bits =
         dst.super_BaseReg.super_Operand.super_Operand_._signature._bits;
  }
  else {
LAB_00130d57:
    EVar3 = 3;
    if (2 < (byte)(bVar2 - 0x2a) && 0x31 < (byte)(bVar2 - 0x33)) {
      return 3;
    }
    if (2 < (byte)(srcTypeId - _kFloatStart) && 0x31 < (byte)(srcTypeId - _kVec32Start)) {
      return 3;
    }
    uVar5 = bVar1 - 2;
    switch(uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f) {
    case 0:
      dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 0x2000149;
      uVar6 = 0x2000149;
      break;
    case 1:
      dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 0x4000151;
      uVar6 = 0x4000151;
      break;
    default:
      goto switchD_00130db0_caseD_2;
    case 3:
      dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 0x8000159;
      uVar6 = 0x8000159;
      break;
    case 7:
      dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 0x10000161;
      uVar6 = 0x10000161;
    }
    this_00 = (this->super_BaseEmitHelper)._emitter;
    this_00->_inlineComment = comment;
    if ((src.super_Operand_._signature._bits & 7) == 2) {
      instId = 0x224;
    }
    else {
      if ((src.super_Operand_._signature._bits & 7) != 1) {
        return 3;
      }
      instId = 0x228;
      src.super_Operand_._signature._bits = uVar6;
      if (bVar1 < 5) {
        instId = 0x1ff;
      }
    }
  }
  EVar3 = BaseEmitter::_emitI(this_00,instId,(Operand_ *)&dst,&src.super_Operand_);
switchD_00130db0_caseD_2:
  return EVar3;
}

Assistant:

Error EmitHelper::emitArgMove(
  const BaseReg& dst_, TypeId dstTypeId,
  const Operand_& src_, TypeId srcTypeId, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (dstTypeId == TypeId::kVoid) {
    const ArchTraits& archTraits = ArchTraits::byArch(_emitter->arch());
    dstTypeId = archTraits.regTypeToTypeId(dst_.type());
  }

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(dstTypeId) && !TypeUtils::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeUtils::isValid(srcTypeId) && !TypeUtils::isAbstract(srcTypeId));

  Reg dst(dst_.as<Reg>());
  Operand src(src_);

  uint32_t dstSize = TypeUtils::sizeOf(dstTypeId);
  uint32_t srcSize = TypeUtils::sizeOf(srcTypeId);

  if (TypeUtils::isInt(dstTypeId)) {
    if (TypeUtils::isInt(srcTypeId)) {
      uint32_t x = uint32_t(dstSize == 8);

      dst.setSignature(OperandSignature{x ? uint32_t(GpX::kSignature) : uint32_t(GpW::kSignature)});
      _emitter->setInlineComment(comment);

      if (src.isReg()) {
        src.setSignature(dst.signature());
        return _emitter->emit(Inst::kIdMov, dst, src);
      }
      else if (src.isMem()) {
        InstId instId = Inst::kIdNone;
          switch (srcTypeId) {
          case TypeId::kInt8: instId = Inst::kIdLdrsb; break;
          case TypeId::kUInt8: instId = Inst::kIdLdrb; break;
          case TypeId::kInt16: instId = Inst::kIdLdrsh; break;
          case TypeId::kUInt16: instId = Inst::kIdLdrh; break;
          case TypeId::kInt32: instId = x ? Inst::kIdLdrsw : Inst::kIdLdr; break;
          case TypeId::kUInt32: instId = Inst::kIdLdr; break;
          case TypeId::kInt64: instId = Inst::kIdLdr; break;
          case TypeId::kUInt64: instId = Inst::kIdLdr; break;
          default:
            return DebugUtils::errored(kErrorInvalidState);
        }
        return _emitter->emit(instId, dst, src);
      }
    }
  }

  if (TypeUtils::isFloat(dstTypeId) || TypeUtils::isVec(dstTypeId)) {
    if (TypeUtils::isFloat(srcTypeId) || TypeUtils::isVec(srcTypeId)) {
      switch (srcSize) {
        case 2: dst.as<Vec>().setSignature(OperandSignature{VecH::kSignature}); break;
        case 4: dst.as<Vec>().setSignature(OperandSignature{VecS::kSignature}); break;
        case 8: dst.as<Vec>().setSignature(OperandSignature{VecD::kSignature}); break;
        case 16: dst.as<Vec>().setSignature(OperandSignature{VecV::kSignature}); break;
        default:
          return DebugUtils::errored(kErrorInvalidState);
      }

      _emitter->setInlineComment(comment);

      if (src.isReg()) {
        InstId instId = srcSize <= 4 ? Inst::kIdFmov_v : Inst::kIdMov_v;
        src.setSignature(dst.signature());
        return _emitter->emit(instId, dst, src);
      }
      else if (src.isMem()) {
        return _emitter->emit(Inst::kIdLdr_v, dst, src);
      }
    }
  }

  return DebugUtils::errored(kErrorInvalidState);
}